

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix3f.cpp
# Opt level: O1

Matrix3f * Matrix3f::uniformScaling(float s)

{
  Matrix3f *in_RDI;
  
  in_RDI->m_elements[0] = s;
  in_RDI->m_elements[1] = 0.0;
  in_RDI->m_elements[2] = 0.0;
  in_RDI->m_elements[3] = 0.0;
  in_RDI->m_elements[4] = s;
  in_RDI->m_elements[5] = 0.0;
  in_RDI->m_elements[6] = 0.0;
  in_RDI->m_elements[7] = 0.0;
  in_RDI->m_elements[8] = s;
  return in_RDI;
}

Assistant:

Matrix3f Matrix3f::uniformScaling( float s )
{
	return Matrix3f
	(
		s, 0, 0,
		0, s, 0,
		0, 0, s
	);
}